

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O3

void __thiscall Scene::camera(Scene *this,double x,double y,Ray *ray)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  dVar1 = (this->eye).y;
  (ray->org).x = (this->eye).x;
  (ray->org).y = dVar1;
  (ray->org).z = (this->eye).z;
  if (this->aperture <= 0.0) {
    dVar10 = (this->view_y).z * y + (this->view_x).z * x + (this->eye_dir).z;
    auVar11._0_8_ = y * (this->view_y).x + (this->view_x).x * x + (this->eye_dir).x;
    auVar11._8_8_ = y * (this->view_y).y + (this->view_x).y * x + (this->eye_dir).y;
    dVar1 = SQRT(dVar10 * dVar10 + auVar11._0_8_ * auVar11._0_8_ + auVar11._8_8_ * auVar11._8_8_);
    auVar7._8_4_ = SUB84(dVar1,0);
    auVar7._0_8_ = dVar1;
    auVar7._12_4_ = (int)((ulong)dVar1 >> 0x20);
    auVar7 = divpd(auVar11,auVar7);
    (ray->dir).x = (double)auVar7._0_8_;
    (ray->dir).y = (double)auVar7._8_8_;
    (ray->dir).z = dVar10 / dVar1;
  }
  else {
    iVar5 = rand();
    dVar9 = (double)iVar5;
    dVar1 = (this->view_x).z;
    dVar3 = (this->view_x).x;
    dVar4 = (this->view_x).y;
    iVar5 = rand();
    dVar2 = (double)iVar5;
    dVar10 = this->aperture;
    auVar6._0_8_ = dVar10 * (dVar2 * (this->view_y).x + dVar9 * dVar3);
    auVar6._8_8_ = dVar10 * (dVar2 * (this->view_y).y + dVar9 * dVar4);
    auVar7 = divpd(auVar6,_DAT_00106300);
    dVar10 = ((dVar2 * (this->view_y).z + dVar1 * dVar9) * dVar10) / 2147483647.0;
    (ray->org).x = (ray->org).x + auVar7._0_8_;
    (ray->org).y = (ray->org).y + auVar7._8_8_;
    (ray->org).z = (ray->org).z + dVar10;
    dVar1 = this->focus;
    dVar10 = ((this->view_y).z * y + (this->view_x).z * x + (this->eye_dir).z * dVar1) - dVar10;
    auVar12._0_8_ =
         (y * (this->view_y).x + x * (this->view_x).x + dVar1 * (this->eye_dir).x) - auVar7._0_8_;
    auVar12._8_8_ =
         (y * (this->view_y).y + x * (this->view_x).y + (this->eye_dir).y * dVar1) - auVar7._8_8_;
    auVar8._0_8_ = SQRT(dVar10 * dVar10 +
                        auVar12._0_8_ * auVar12._0_8_ + auVar12._8_8_ * auVar12._8_8_);
    auVar8._8_8_ = auVar8._0_8_;
    auVar7 = divpd(auVar12,auVar8);
    (ray->dir).x = (double)auVar7._0_8_;
    (ray->dir).y = (double)auVar7._8_8_;
    (ray->dir).z = dVar10 / auVar8._0_8_;
  }
  return;
}

Assistant:

void Scene::camera(double x, double y, Ray& ray)
{
    ray.org  = eye;
    if (aperture > 0.0) // камера не точечная, исп с AdaptiveDistRenderScene
    {
        // построить случайную точку на  линзе
        Vector lens_point = (view_x * (double)rand() + view_y * (double)rand()) * aperture / RAND_MAX;
        ray.org += lens_point;
        ray.dir = eye_dir * focus + view_x * x + view_y * y - lens_point;
        ray.dir = normalize(ray.dir);
    } else {
        ray.dir  = normalize(eye_dir + view_x * x + view_y * y);
    }
}